

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall
CMU462::DynamicScene::Mesh::Mesh(Mesh *this,PolymeshInfo *polyMesh,Matrix4x4 *transform)

{
  _Rb_tree_header *p_Var1;
  double *pdVar2;
  undefined8 *puVar3;
  pointer pPVar4;
  BSDF *pBVar5;
  Skeleton *this_00;
  long lVar6;
  int i;
  ulong uVar7;
  Polygon *p;
  pointer __x;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> vertices;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  polygons;
  Vector4D local_a8;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  Vector3D local_68;
  Vector4D local_50;
  
  SceneObject::SceneObject(&this->super_SceneObject);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00274690;
  HalfedgeMesh::HalfedgeMesh(&this->mesh);
  (this->idToElement)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->idToElement)._M_t._M_impl.super__Rb_tree_header;
  (this->idToElement)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bevelVertices).
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bevelVertices).
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bevelVertices).
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beveledVertexPos).x = 0.0;
  (this->beveledVertexPos).y = 0.0;
  (this->beveledVertexPos).z = 0.0;
  (this->beveledEdgePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beveledEdgePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beveledEdgePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beveledFacePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beveledFacePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beveledFacePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->idToElement)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->idToElement)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->idToElement)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  polygons.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  polygons.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  polygons.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar4 = (polyMesh->polygons).
           super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (__x = (polyMesh->polygons).
             super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pPVar4; __x = __x + 1) {
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back(&polygons,&__x->vertex_indices);
  }
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            (&vertices,&polyMesh->vertices);
  lVar6 = 0;
  uVar7 = 0;
  while( true ) {
    if ((ulong)(((long)vertices.
                       super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)vertices.
                      super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar7) break;
    pdVar2 = (double *)
             ((long)&(vertices.
                      super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                      _M_impl.super__Vector_impl_data._M_start)->x + lVar6);
    local_a8.x = *pdVar2;
    local_a8.y = pdVar2[1];
    local_a8.z = *(double *)
                  ((long)&(vertices.
                           super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                           _M_impl.super__Vector_impl_data._M_start)->z + lVar6);
    local_a8.w = 1.0;
    Matrix4x4::operator*(transform,&local_a8);
    Vector4D::projectTo3D(&local_50);
    *(undefined8 *)
     ((long)&(vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
              _M_impl.super__Vector_impl_data._M_start)->z + lVar6) = local_70;
    puVar3 = (undefined8 *)
             ((long)&(vertices.
                      super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                      _M_impl.super__Vector_impl_data._M_start)->x + lVar6);
    *puVar3 = local_80;
    puVar3[1] = uStack_78;
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x18;
  }
  HalfedgeMesh::build(&this->mesh,&polygons,&vertices);
  if (polyMesh->material == (MaterialInfo *)0x0) {
    pBVar5 = (BSDF *)operator_new(0x28);
    pBVar5->_vptr_BSDF = (_func_int **)&PTR_f_00274f88;
    pBVar5[1]._vptr_BSDF = (_func_int **)0x3f8000003f800000;
    *(undefined ***)&pBVar5[1].rasterize_color = &PTR__Sampler3D_002751c0;
    (pBVar5->rasterize_color).r = 1.0;
    (pBVar5->rasterize_color).g = 1.0;
    *(undefined8 *)&(pBVar5->rasterize_color).b = 0x3f8000003f800000;
  }
  else {
    pBVar5 = polyMesh->material->bsdf;
  }
  this->bsdf = pBVar5;
  (this->super_SceneObject).scale.x = 1.0;
  (this->super_SceneObject).scale.y = 1.0;
  (this->super_SceneObject).scale.z = 1.0;
  local_68.x = 1.0;
  local_68.y = 1.0;
  local_68.z = 1.0;
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).scales,0.0,&local_68);
  this_00 = (Skeleton *)operator_new(0x1e0);
  Skeleton::Skeleton(this_00,this);
  this->skeleton = this_00;
  std::_Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~_Vector_base
            (&vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&polygons);
  return;
}

Assistant:

Mesh::Mesh( Collada::PolymeshInfo& polyMesh, const Matrix4x4& transform)
{
   // Build halfedge mesh from polygon soup
   vector< vector<size_t> > polygons;
   for (const Collada::Polygon& p : polyMesh.polygons) {
      polygons.push_back(p.vertex_indices);
   }
   vector<Vector3D> vertices = polyMesh.vertices; // DELIBERATE COPY.
   for (int i = 0; i < vertices.size(); i++) {
      vertices[i] = (transform * Vector4D(vertices[i], 1)).projectTo3D();
   }

   mesh.build(polygons, vertices);  
   if (polyMesh.material) {
      bsdf = polyMesh.material->bsdf;
   } else {
//      bsdf = new DiffuseBSDF(Spectrum(0.5f,0.5f,0.5f));
      bsdf = new DiffuseBSDF(Spectrum(1., 1., 1.));
   }

   scale = Vector3D(1., 1., 1.);
   scales.setValue(0, scale);

   skeleton = new Skeleton(this);
}